

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManCutMatch(Nf_Man_t *p,int iObj)

{
  float *pfVar1;
  Nf_Cfg_t NVar2;
  int iVar3;
  int iVar4;
  Nf_Obj_t *__s;
  Nf_Mat_t (*paNVar5) [2];
  Nf_Mat_t *pNVar6;
  Nf_Mat_t *pNVar7;
  float fVar8;
  float fVar9;
  int local_68;
  int local_64;
  int Required [2];
  int *pCutSet;
  int *pCut;
  int i;
  float FlowRefNf;
  float FlowRefPf;
  Nf_Mat_t *pAn;
  Nf_Mat_t *pAp;
  Nf_Mat_t *pDn;
  Nf_Mat_t *pDp;
  Nf_Obj_t *pBest;
  int iObj_local;
  Nf_Man_t *p_local;
  
  __s = Nf_ManObj(p,iObj);
  paNVar5 = __s->M + 1;
  pNVar6 = __s->M[0] + 1;
  pNVar7 = __s->M[1] + 1;
  fVar8 = Nf_ObjFlowRefs(p,iObj,0);
  fVar9 = Nf_ObjFlowRefs(p,iObj,1);
  Required = (int  [2])Nf_ObjCutSet(p,iObj);
  memset(&local_68,0,8);
  if (p->Iter != 0) {
    Nf_ObjComputeRequired(p,iObj);
    local_68 = Nf_ObjRequired(p,iObj,0);
    local_64 = Nf_ObjRequired(p,iObj,1);
  }
  memset(__s,0,0x40);
  __s->M[0][0].D = 0x3fffffff;
  __s->M[0][0].F = 3.4028235e+38;
  __s->M[1][0].D = 0x3fffffff;
  __s->M[1][0].F = 3.4028235e+38;
  __s->M[0][1].D = 0x3fffffff;
  __s->M[0][1].F = 3.4028235e+38;
  __s->M[1][1].D = 0x3fffffff;
  __s->M[1][1].F = 3.4028235e+38;
  pCut._4_4_ = 0;
  pCutSet = (int *)((long)Required + 4);
  while (pCut._4_4_ < *(int *)Required) {
    iVar3 = Nf_CutFunc(pCutSet);
    iVar3 = Abc_Lit2Var(iVar3);
    iVar4 = Vec_WecSize(p->vTt2Match);
    if (iVar3 < iVar4) {
      iVar3 = Nf_CutIsTriv(pCutSet,iObj);
      if (iVar3 != 0) {
        __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fa,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      iVar3 = Nf_CutSize(pCutSet);
      if (p->pPars->nLutSize < iVar3) {
        __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fb,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      iVar3 = Nf_CutFunc(pCutSet);
      iVar3 = Abc_Lit2Var(iVar3);
      iVar4 = Vec_WecSize(p->vTt2Match);
      if (iVar4 <= iVar3) {
        __assert_fail("Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fc,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      Nf_ManCutMatchOne(p,iObj,pCutSet,(int *)Required);
    }
    pCut._4_4_ = pCut._4_4_ + 1;
    iVar3 = Nf_CutSize(pCutSet);
    pCutSet = pCutSet + (iVar3 + 1);
  }
  __s->M[0][0].F = __s->M[0][0].F / fVar8;
  __s->M[0][1].F = __s->M[0][1].F / fVar8;
  __s->M[1][0].F = __s->M[1][0].F / fVar9;
  __s->M[1][1].F = __s->M[1][1].F / fVar9;
  if ((0x3ffffffe < __s->M[0][0].D) && (0x3ffffffe < __s->M[1][0].D)) {
    __assert_fail("pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x512,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (__s->M[1][0].D + p->InvDelayI < __s->M[0][0].D) {
    NVar2 = ((Nf_Mat_t *)((long)paNVar5 + 0))->Cfg;
    *(undefined4 *)&__s->M[0][0].field_0x0 =
         *(undefined4 *)&((Nf_Mat_t *)((long)paNVar5 + 0))->field_0x0;
    __s->M[0][0].Cfg = NVar2;
    fVar8 = __s->M[1][0].F;
    __s->M[0][0].D = __s->M[1][0].D;
    __s->M[0][0].F = fVar8;
    __s->M[0][0].D = p->InvDelayI + __s->M[0][0].D;
    __s->M[0][0].F = p->InvAreaF + __s->M[0][0].F;
    *(uint *)__s->M[0] = *(uint *)__s->M[0] & 0xbfffffff | 0x40000000;
    if (__s->M[0][1].D == 0x3fffffff) {
      NVar2 = __s->M[0][0].Cfg;
      *(undefined4 *)&pNVar6->field_0x0 = *(undefined4 *)&__s->M[0][0].field_0x0;
      pNVar6->Cfg = NVar2;
      fVar8 = __s->M[0][0].F;
      __s->M[0][1].D = __s->M[0][0].D;
      __s->M[0][1].F = fVar8;
    }
  }
  else if (__s->M[0][0].D + p->InvDelayI < __s->M[1][0].D) {
    NVar2 = __s->M[0][0].Cfg;
    *(undefined4 *)&((Nf_Mat_t *)((long)paNVar5 + 0))->field_0x0 =
         *(undefined4 *)&__s->M[0][0].field_0x0;
    ((Nf_Mat_t *)((long)paNVar5 + 0))->Cfg = NVar2;
    fVar8 = __s->M[0][0].F;
    __s->M[1][0].D = __s->M[0][0].D;
    __s->M[1][0].F = fVar8;
    __s->M[1][0].D = p->InvDelayI + __s->M[1][0].D;
    __s->M[1][0].F = p->InvAreaF + __s->M[1][0].F;
    *(uint *)*paNVar5 = *(uint *)*paNVar5 & 0xbfffffff | 0x40000000;
    if (__s->M[1][1].D == 0x3fffffff) {
      NVar2 = ((Nf_Mat_t *)((long)paNVar5 + 0))->Cfg;
      *(undefined4 *)&pNVar7->field_0x0 =
           *(undefined4 *)&((Nf_Mat_t *)((long)paNVar5 + 0))->field_0x0;
      pNVar7->Cfg = NVar2;
      fVar8 = __s->M[1][0].F;
      __s->M[1][1].D = __s->M[1][0].D;
      __s->M[1][1].F = fVar8;
    }
  }
  if ((__s->M[0][1].D == 0x3fffffff) ||
     ((__s->M[1][1].F + p->InvAreaF + 0.001 < __s->M[0][1].F &&
      (__s->M[1][1].D + p->InvDelayI <= local_68)))) {
    if (p->Iter < 1) {
      __assert_fail("p->Iter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x52b,"void Nf_ManCutMatch(Nf_Man_t *, int)");
    }
    NVar2 = pNVar7->Cfg;
    *(undefined4 *)&pNVar6->field_0x0 = *(undefined4 *)&pNVar7->field_0x0;
    pNVar6->Cfg = NVar2;
    fVar8 = __s->M[1][1].F;
    __s->M[0][1].D = __s->M[1][1].D;
    __s->M[0][1].F = fVar8;
    __s->M[0][1].D = p->InvDelayI + __s->M[0][1].D;
    __s->M[0][1].F = p->InvAreaF + __s->M[0][1].F;
    *(uint *)pNVar6 = *(uint *)pNVar6 & 0xbfffffff | 0x40000000;
    if (__s->M[0][0].D == 0x3fffffff) {
      NVar2 = pNVar6->Cfg;
      *(undefined4 *)&__s->M[0][0].field_0x0 = *(undefined4 *)&pNVar6->field_0x0;
      __s->M[0][0].Cfg = NVar2;
      fVar8 = __s->M[0][1].F;
      __s->M[0][0].D = __s->M[0][1].D;
      __s->M[0][0].F = fVar8;
    }
  }
  else if ((__s->M[1][1].D == 0x3fffffff) ||
          ((__s->M[0][1].F + p->InvAreaF + 0.001 < __s->M[1][1].F &&
           (__s->M[0][1].D + p->InvDelayI <= local_64)))) {
    if (p->Iter < 1) {
      __assert_fail("p->Iter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x537,"void Nf_ManCutMatch(Nf_Man_t *, int)");
    }
    NVar2 = pNVar6->Cfg;
    *(undefined4 *)&pNVar7->field_0x0 = *(undefined4 *)&pNVar6->field_0x0;
    pNVar7->Cfg = NVar2;
    fVar8 = __s->M[0][1].F;
    __s->M[1][1].D = __s->M[0][1].D;
    __s->M[1][1].F = fVar8;
    __s->M[1][1].D = p->InvDelayI + __s->M[1][1].D;
    __s->M[1][1].F = p->InvAreaF + __s->M[1][1].F;
    *(uint *)pNVar7 = *(uint *)pNVar7 & 0xbfffffff | 0x40000000;
    if (__s->M[1][0].D == 0x3fffffff) {
      NVar2 = pNVar7->Cfg;
      *(undefined4 *)&((Nf_Mat_t *)((long)paNVar5 + 0))->field_0x0 =
           *(undefined4 *)&pNVar7->field_0x0;
      ((Nf_Mat_t *)((long)paNVar5 + 0))->Cfg = NVar2;
      fVar8 = __s->M[1][1].F;
      __s->M[1][0].D = __s->M[1][1].D;
      __s->M[1][0].F = fVar8;
    }
  }
  if (__s->M[0][0].D == 0x3fffffff) {
    printf("Object %d has pDp unassigned.\n",(ulong)(uint)iObj);
  }
  if (__s->M[1][0].D == 0x3fffffff) {
    printf("Object %d has pDn unassigned.\n",(ulong)(uint)iObj);
  }
  if (__s->M[0][1].D == 0x3fffffff) {
    printf("Object %d has pAp unassigned.\n",(ulong)(uint)iObj);
  }
  if (__s->M[1][1].D == 0x3fffffff) {
    printf("Object %d has pAn unassigned.\n",(ulong)(uint)iObj);
  }
  if (0x3ffffffe < __s->M[0][0].D) {
    __assert_fail("pDp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x54f,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < __s->M[1][0].D) {
    __assert_fail("pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x550,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < __s->M[0][1].D) {
    __assert_fail("pAp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x551,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < __s->M[1][1].D) {
    __assert_fail("pAn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x552,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar1 = &__s->M[0][0].F;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) {
    __assert_fail("pDp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x554,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar1 = &__s->M[1][0].F;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) {
    __assert_fail("pDn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x555,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar1 = &__s->M[0][1].F;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) {
    __assert_fail("pAp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x556,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar1 = &__s->M[1][1].F;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) {
    __assert_fail("pAn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x557,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  return;
}

Assistant:

void Nf_ManCutMatch( Nf_Man_t * p, int iObj )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    Nf_Mat_t * pDp = &pBest->M[0][0];
    Nf_Mat_t * pDn = &pBest->M[1][0];
    Nf_Mat_t * pAp = &pBest->M[0][1];
    Nf_Mat_t * pAn = &pBest->M[1][1];
    float FlowRefPf  = Nf_ObjFlowRefs(p, iObj, 0);
    float FlowRefNf  = Nf_ObjFlowRefs(p, iObj, 1);
    int i, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    int Required[2] = {0};
    if ( p->Iter )
    {
        Nf_ObjComputeRequired( p, iObj );
        Required[0] = Nf_ObjRequired( p, iObj, 0 );
        Required[1] = Nf_ObjRequired( p, iObj, 1 );
    }
    memset( pBest, 0, sizeof(Nf_Obj_t) );
    pDp->D = SCL_INFINITY; pDp->F = FLT_MAX;
    pDn->D = SCL_INFINITY; pDn->F = FLT_MAX;
    pAp->D = SCL_INFINITY; pAp->F = FLT_MAX;
    pAn->D = SCL_INFINITY; pAn->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, i )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        assert( !Nf_CutIsTriv(pCut, iObj) );
        assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
        assert( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) );
        Nf_ManCutMatchOne( p, iObj, pCut, pCutSet );
    }

/*
    if ( 461 == iObj && p->Iter == 0 )
    {
        printf( "\nObj %6d (%.2f %.2f):\n", iObj, Scl_Int2Flt(Required[0]), Scl_Int2Flt(Required[1]) );
        Nf_ManCutMatchPrint( p, iObj, "Dp", &pBest->M[0][0] );
        Nf_ManCutMatchPrint( p, iObj, "Dn", &pBest->M[1][0] );
        Nf_ManCutMatchPrint( p, iObj, "Ap", &pBest->M[0][1] );
        Nf_ManCutMatchPrint( p, iObj, "An", &pBest->M[1][1] );
        printf( "\n" );
    }
*/
    // divide by ref count
    pDp->F = pDp->F / FlowRefPf;
    pAp->F = pAp->F / FlowRefPf;
    pDn->F = pDn->F / FlowRefNf;
    pAn->F = pAn->F / FlowRefNf;

    // add the inverters
    assert( pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY );
    if ( pDp->D > pDn->D + p->InvDelayI )
    {
        *pDp = *pDn;
        pDp->D += p->InvDelayI;
        pDp->F += p->InvAreaF;
        pDp->fCompl = 1;
        if ( pAp->D == SCL_INFINITY )
            *pAp = *pDp;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 1 );
    }
    else if ( pDn->D > pDp->D + p->InvDelayI )
    {
        *pDn = *pDp;
        pDn->D += p->InvDelayI;
        pDn->F += p->InvAreaF;
        pDn->fCompl = 1;
        if ( pAn->D == SCL_INFINITY )
            *pAn = *pDn;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 0 );
    }
    //assert( pAp->F < FLT_MAX || pAn->F < FLT_MAX );
    // try replacing pos with neg
    if ( pAp->D == SCL_INFINITY || (pAp->F > pAn->F + p->InvAreaF + NF_EPSILON && pAn->D + p->InvDelayI <= Required[0]) )
    {
        assert( p->Iter > 0 );
        *pAp = *pAn;
        pAp->D += p->InvDelayI;
        pAp->F += p->InvAreaF;
        pAp->fCompl = 1;
        if ( pDp->D == SCL_INFINITY )
            *pDp = *pAp;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 1 );
    }
    // try replacing neg with pos
    else if ( pAn->D == SCL_INFINITY || (pAn->F > pAp->F + p->InvAreaF + NF_EPSILON && pAp->D + p->InvDelayI <= Required[1]) )
    {
        assert( p->Iter > 0 );
        *pAn = *pAp;
        pAn->D += p->InvDelayI;
        pAn->F += p->InvAreaF;
        pAn->fCompl = 1;
        if ( pDn->D == SCL_INFINITY )
            *pDn = *pAn;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 0 );
    }

    if ( pDp->D == SCL_INFINITY )
        printf( "Object %d has pDp unassigned.\n", iObj );
    if ( pDn->D == SCL_INFINITY )
        printf( "Object %d has pDn unassigned.\n", iObj );
    if ( pAp->D == SCL_INFINITY )
        printf( "Object %d has pAp unassigned.\n", iObj );
    if ( pAn->D == SCL_INFINITY )
        printf( "Object %d has pAn unassigned.\n", iObj );
/*
    pDp->F = Abc_MinFloat( pDp->F, FLT_MAX/SCL_NUM );
    pDn->F = Abc_MinFloat( pDn->F, FLT_MAX/SCL_NUM );
    pAp->F = Abc_MinFloat( pAp->F, FLT_MAX/SCL_NUM );  
    pAn->F = Abc_MinFloat( pAn->F, FLT_MAX/SCL_NUM );
*/    
    assert( pDp->D < SCL_INFINITY );
    assert( pDn->D < SCL_INFINITY );
    assert( pAp->D < SCL_INFINITY );
    assert( pAn->D < SCL_INFINITY );

    assert( pDp->F < FLT_MAX );
    assert( pDn->F < FLT_MAX );
    assert( pAp->F < FLT_MAX );
    assert( pAn->F < FLT_MAX );

/*
    if ( p->Iter && (pDp->D > Required[0] || pDn->D > Required[1]) )
    {
        printf( "%5d : ", iObj );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Rp = %6.2f  ", Scl_Int2Flt(Required[0]) );
        printf( "Rn = %6.2f  ", Scl_Int2Flt(Required[1]) );
        printf( "\n" );
    }
*/
}